

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O3

bool __thiscall
cmVariableWatch::AddWatch
          (cmVariableWatch *this,string *variable,WatchMethod method,void *client_data,
          DeleteData delete_data)

{
  iterator __position;
  long *plVar1;
  Pair *pPVar2;
  vector<cmVariableWatch::Pair*,std::allocator<cmVariableWatch::Pair*>> *this_00;
  long lVar3;
  ulong uVar4;
  Pair *x;
  ulong uVar5;
  bool bVar6;
  auto_ptr<cmVariableWatch::Pair> p;
  auto_ptr<cmVariableWatch::Pair> local_40;
  Pair *local_38;
  
  pPVar2 = (Pair *)operator_new(0x18);
  pPVar2->Method = method;
  pPVar2->ClientData = client_data;
  pPVar2->DeleteDataCall = delete_data;
  local_40.x_ = pPVar2;
  this_00 = (vector<cmVariableWatch::Pair*,std::allocator<cmVariableWatch::Pair*>> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
            ::operator[](&this->WatchMap,variable);
  __position._M_current = *(Pair ***)(this_00 + 8);
  lVar3 = (long)__position._M_current - *(long *)this_00;
  if (lVar3 == 0) {
    bVar6 = true;
  }
  else {
    uVar4 = lVar3 >> 3;
    bVar6 = false;
    uVar5 = 1;
    do {
      if (((client_data != (void *)0x0) &&
          (plVar1 = *(long **)(*(long *)this_00 + -8 + uVar5 * 8), (WatchMethod)*plVar1 == method))
         && ((void *)plVar1[1] == client_data)) goto LAB_00415b2b;
      bVar6 = uVar4 <= uVar5;
      lVar3 = (-(ulong)(uVar4 == 0) - uVar4) + uVar5;
      uVar5 = uVar5 + 1;
    } while (lVar3 != 0);
  }
  local_40.x_ = (Pair *)0x0;
  local_38 = pPVar2;
  if (__position._M_current == *(Pair ***)(this_00 + 0x10)) {
    std::vector<cmVariableWatch::Pair*,std::allocator<cmVariableWatch::Pair*>>::
    _M_realloc_insert<cmVariableWatch::Pair*>(this_00,__position,&local_38);
  }
  else {
    *__position._M_current = pPVar2;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
LAB_00415b2b:
  ::cm::auto_ptr<cmVariableWatch::Pair>::~auto_ptr(&local_40);
  return bVar6;
}

Assistant:

bool cmVariableWatch::AddWatch(const std::string& variable, WatchMethod method,
                               void* client_data /*=0*/,
                               DeleteData delete_data /*=0*/)
{
  CM_AUTO_PTR<cmVariableWatch::Pair> p(new cmVariableWatch::Pair);
  p->Method = method;
  p->ClientData = client_data;
  p->DeleteDataCall = delete_data;
  cmVariableWatch::VectorOfPairs* vp = &this->WatchMap[variable];
  cmVariableWatch::VectorOfPairs::size_type cc;
  for (cc = 0; cc < vp->size(); cc++) {
    cmVariableWatch::Pair* pair = (*vp)[cc];
    if (pair->Method == method && client_data &&
        client_data == pair->ClientData) {
      // Callback already exists
      return false;
    }
  }
  vp->push_back(p.release());
  return true;
}